

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *pXVar1;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_358;
  xml_output local_340;
  xml_output local_308;
  xml_output local_2d0;
  xml_output local_298;
  xml_output local_260;
  xml_output local_228;
  xml_output local_1f0;
  xml_output local_1b8;
  xml_output local_180;
  xml_output local_148;
  xml_output local_110;
  QArrayDataPointer<char16_t> local_d8;
  xml_output local_c0;
  QArrayDataPointer<char16_t> local_88;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_88,"Tool");
  tag(&local_70,(QString *)&local_88);
  pXVar1 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  QString::QString((QString *)&local_d8,"VCLibrarianTool");
  attrS(&local_c0,"Name",(QString *)&local_d8);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_c0);
  attrX(&local_110,"AdditionalDependencies",(QStringList *)((long)__buf + 8),",");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_110);
  attrX(&local_148,"AdditionalLibraryDirectories",(QStringList *)((long)__buf + 0x20),",");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_148);
  attrX(&local_180,"AdditionalOptions",(QStringList *)((long)__buf + 0x38)," ");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_180);
  attrX(&local_1b8,"ExportNamedFunctions",(QStringList *)((long)__buf + 0x50),",");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_1b8);
  attrX(&local_1f0,"ForceSymbolReferences",(QStringList *)((long)__buf + 0x68),",");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_1f0);
  attrT(&local_228,"IgnoreAllDefaultLibraries",*(triState *)((long)__buf + 0x80));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_228);
  attrX(&local_260,"IgnoreDefaultLibraryNames",(QStringList *)((long)__buf + 0x88),",");
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_260);
  attrS(&local_298,"ModuleDefinitionFile",(QString *)((long)__buf + 0xa0));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_298);
  attrS(&local_2d0,"OutputFile",(QString *)((long)__buf + 0xb8));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_2d0);
  attrT(&local_308,"SuppressStartupBanner",*(triState *)((long)__buf + 0xd0));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_308);
  QString::QString((QString *)&QStack_358,"Tool");
  closetag(&local_340,(QString *)&QStack_358);
  XmlOutput::operator<<(pXVar1,&local_340);
  XmlOutput::xml_output::~xml_output(&local_340);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_358);
  XmlOutput::xml_output::~xml_output(&local_308);
  XmlOutput::xml_output::~xml_output(&local_2d0);
  XmlOutput::xml_output::~xml_output(&local_298);
  XmlOutput::xml_output::~xml_output(&local_260);
  XmlOutput::xml_output::~xml_output(&local_228);
  XmlOutput::xml_output::~xml_output(&local_1f0);
  XmlOutput::xml_output::~xml_output(&local_1b8);
  XmlOutput::xml_output::~xml_output(&local_180);
  XmlOutput::xml_output::~xml_output(&local_148);
  XmlOutput::xml_output::~xml_output(&local_110);
  XmlOutput::xml_output::~xml_output(&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  XmlOutput::xml_output::~xml_output(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCLibrarianTool &tool)
{
    xml
        << tag(_Tool)
            << attrS(_Name, _VCLibrarianTool)
            << attrX(_AdditionalDependencies, tool.AdditionalDependencies)
            << attrX(_AdditionalLibraryDirectories, tool.AdditionalLibraryDirectories)
            << attrX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrX(_ExportNamedFunctions, tool.ExportNamedFunctions)
            << attrX(_ForceSymbolReferences, tool.ForceSymbolReferences)
            << attrT(_IgnoreAllDefaultLibraries, tool.IgnoreAllDefaultLibraries)
            << attrX(_IgnoreDefaultLibraryNames, tool.IgnoreDefaultLibraryNames)
            << attrS(_ModuleDefinitionFile, tool.ModuleDefinitionFile)
            << attrS(_OutputFile, tool.OutputFile)
            << attrT(_SuppressStartupBanner, tool.SuppressStartupBanner)
        << closetag(_Tool);
}